

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O1

void __thiscall Label::Label(Label *this,Identifier *name)

{
  pointer pcVar1;
  
  (this->name)._name._M_dataplus._M_p = (pointer)&(this->name)._name.field_2;
  pcVar1 = (name->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (name->_name)._M_string_length);
  (this->originalName)._name._M_dataplus._M_p = (pointer)&(this->originalName)._name.field_2;
  pcVar1 = (name->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->originalName,pcVar1,pcVar1 + (name->_name)._M_string_length);
  this->value = 0;
  this->physicalValue = 0;
  *(undefined4 *)((long)&this->physicalValue + 7) = 0;
  this->updateInfo = true;
  this->info = 0;
  this->section = 0;
  return;
}

Assistant:

Label::Label(const Identifier &name) :
	name(name),
	originalName(name)
{
}